

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

int soplex::
    LPFreadColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (char **pos,NameSet *colnames,
              LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *colset,LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *emptycol,SPxOut *spxout)

{
  char cVar1;
  char *pcVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  Verbosity old_verbosity;
  char name [8192];
  DataKey local_2040;
  char local_2038 [8200];
  
  pcVar2 = *pos;
  lVar9 = -1;
  do {
    cVar1 = pcVar2[lVar9 + 1];
    pvVar6 = memchr("+-.<>= ",(int)cVar1,8);
    lVar9 = lVar9 + 1;
    if (pvVar6 != (void *)0x0) break;
  } while (cVar1 != '\0');
  if (lVar9 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      local_2038[uVar7] = pcVar2[uVar7];
      lVar4 = uVar7 + 1;
      uVar7 = uVar7 + 1;
      *pos = pcVar2 + lVar4;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    uVar7 = uVar7 & 0xffffffff;
  }
  local_2038[uVar7] = '\0';
  iVar5 = NameSet::number(colnames,local_2038);
  if (iVar5 < 0) {
    if (emptycol ==
        (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      if ((spxout != (SPxOut *)0x0) && (0 < (int)spxout->m_verbosity)) {
        local_2040.info = spxout->m_verbosity;
        (*spxout->_vptr_SPxOut[2])(spxout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (spxout->m_streams[spxout->m_verbosity],"WLPFRD02 Unknown variable \"",0x1b);
        poVar3 = spxout->m_streams[spxout->m_verbosity];
        sVar8 = strlen(local_2038);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2038,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (spxout->m_streams[spxout->m_verbosity],"\" ",2);
        (*spxout->_vptr_SPxOut[2])(spxout,&local_2040);
      }
    }
    else {
      iVar5 = (colnames->set).thenum;
      NameSet::add(colnames,local_2038);
      local_2040.info = 0;
      local_2040.idx = -1;
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(colset,&local_2040,emptycol);
    }
  }
  uVar7 = (ulong)(byte)**pos;
  if ((uVar7 < 0x21) && ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0)) {
    *pos = *pos + 1;
  }
  return iVar5;
}

Assistant:

static int LPFreadColName(char*& pos, NameSet* colnames, LPColSetBase<R>& colset,
                          const LPColBase<R>* emptycol, SPxOut* spxout)
{
   assert(LPFisColName(pos));
   assert(colnames != nullptr);

   char        name[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   int         i;
   int         colidx;

   // These are the characters that are not allowed in a column name.
   while((strchr("+-.<>= ", *s) == nullptr) && (*s != '\0'))
      s++;

   for(i = 0; pos != s; i++, pos++)
      name[i] = *pos;

   name[i] = '\0';

   if((colidx = colnames->number(name)) < 0)
   {
      // We only add the name if we got an empty column.
      if(emptycol == nullptr)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD02 Unknown variable \"" << name << "\" ";)
      }
      else
      {
         colidx = colnames->num();
         colnames->add(name);
         colset.add(*emptycol);
      }
   }

   SPxOut::debug(spxout, "DLPFRD03 LPFreadColName [{}] = {}\n", name, colidx);

   if(LPFisSpace(*pos))
      pos++;

   return colidx;
}